

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

string * __thiscall
helics::CommonCore::getDestinationTargets_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  char cVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  FederateState *pFVar3;
  PublicationInfo *this_00;
  string *psVar4;
  EndpointInfo *this_01;
  
  ppVar2 = getHandleInfo(this,handle);
  if (ppVar2 != (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    cVar1 = *(char *)((long)&(ppVar2->first)._M_string_length + 4);
    if (cVar1 == 'e') {
      pFVar3 = getFederateAt(this,(LocalFederateId)(BaseType)(ppVar2->first)._M_string_length);
      this_01 = InterfaceInfo::getEndpoint(&pFVar3->interfaceInformation,handle);
      if (this_01 != (EndpointInfo *)0x0) {
        psVar4 = EndpointInfo::getDestinationTargets_abi_cxx11_(this_01);
        return psVar4;
      }
    }
    else if (cVar1 == 'p') {
      pFVar3 = getFederateAt(this,(LocalFederateId)(BaseType)(ppVar2->first)._M_string_length);
      this_00 = InterfaceInfo::getPublication(&pFVar3->interfaceInformation,handle);
      if (this_00 != (PublicationInfo *)0x0) {
        psVar4 = PublicationInfo::getTargets_abi_cxx11_(this_00);
        return psVar4;
      }
    }
  }
  return (string *)&gEmptyString_abi_cxx11_;
}

Assistant:

const std::string& CommonCore::getDestinationTargets(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT:
                return gEmptyString;
            case InterfaceType::PUBLICATION: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* pubInfo = fed->interfaces().getPublication(handle);
                if (pubInfo != nullptr) {
                    return pubInfo->getTargets();
                }
                break;
            }
            case InterfaceType::ENDPOINT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* eptInfo = fed->interfaces().getEndpoint(handle);
                if (eptInfo != nullptr) {
                    return eptInfo->getDestinationTargets();
                }
                break;
            }
            case InterfaceType::FILTER:
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}